

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O0

void just_test_test_case_f_test_read_back_content(void)

{
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  undefined1 local_28 [8];
  read_back_tester test;
  
  anon_unknown.dwarf_8ce9::read_back_tester::read_back_tester((read_back_tester *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  anon_unknown.dwarf_8ce9::read_back_tester::operator()((read_back_tester *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"hello world",&local_81);
  anon_unknown.dwarf_8ce9::read_back_tester::operator()((read_back_tester *)local_28,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"hello\nworld",&local_a9);
  anon_unknown.dwarf_8ce9::read_back_tester::operator()((read_back_tester *)local_28,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"hello\rworld",&local_d1);
  anon_unknown.dwarf_8ce9::read_back_tester::operator()((read_back_tester *)local_28,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"hello\r\nworld",&local_f9)
  ;
  anon_unknown.dwarf_8ce9::read_back_tester::operator()((read_back_tester *)local_28,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  anon_unknown.dwarf_8ce9::read_back_tester::~read_back_tester((read_back_tester *)local_28);
  return;
}

Assistant:

JUST_TEST_CASE(test_read_back_content)
{
  read_back_tester test;

  test("");
  test("hello world");
  test("hello\nworld");
  test("hello\rworld");
  test("hello\r\nworld");
}